

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

bool __thiscall
cmInstallCommand::HandleScriptMode
          (cmInstallCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  size_type sVar4;
  const_reference pvVar5;
  ulong uVar6;
  char *pcVar7;
  cmInstallScriptGenerator *pcVar8;
  char *pcVar9;
  cmGlobalGenerator *this_00;
  allocator local_141;
  string local_140;
  allocator local_119;
  string local_118;
  string local_f8 [8];
  string code;
  string local_d0;
  undefined1 local_b0 [8];
  string script;
  size_t i_1;
  string local_80;
  ulong local_50;
  size_t i;
  string local_40 [2];
  bool doing_code;
  bool doing_script;
  int componentCount;
  string component;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmInstallCommand *this_local;
  
  component.field_2._8_8_ = args;
  std::__cxx11::string::string(local_40,(string *)&this->DefaultComponentName);
  i._4_4_ = 0;
  i._3_1_ = 0;
  i._2_1_ = 0;
  for (local_50 = 0; uVar6 = local_50,
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)component.field_2._8_8_), uVar6 < sVar4; local_50 = local_50 + 1) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)component.field_2._8_8_,local_50);
    bVar3 = std::operator==(pvVar5,"COMPONENT");
    if ((bVar3) &&
       (uVar6 = local_50 + 1,
       sVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)component.field_2._8_8_), uVar6 < sVar4)) {
      i._4_4_ = i._4_4_ + 1;
      local_50 = local_50 + 1;
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)component.field_2._8_8_,local_50);
      std::__cxx11::string::operator=(local_40,(string *)pvVar5);
    }
  }
  if (i._4_4_ < 2) {
    for (script.field_2._8_8_ = 0; uVar2 = script.field_2._8_8_,
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)component.field_2._8_8_), (ulong)uVar2 < sVar4;
        script.field_2._8_8_ = script.field_2._8_8_ + 1) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)component.field_2._8_8_,script.field_2._8_8_);
      bVar3 = std::operator==(pvVar5,"SCRIPT");
      if (bVar3) {
        i._3_1_ = 1;
        i._2_1_ = 0;
      }
      else {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)component.field_2._8_8_,script.field_2._8_8_);
        bVar3 = std::operator==(pvVar5,"CODE");
        if (bVar3) {
          i._3_1_ = 0;
          i._2_1_ = 1;
        }
        else {
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)component.field_2._8_8_,script.field_2._8_8_);
          bVar3 = std::operator==(pvVar5,"COMPONENT");
          if (bVar3) {
            i._3_1_ = 0;
            i._2_1_ = 0;
          }
          else if ((i._3_1_ & 1) == 0) {
            if ((i._2_1_ & 1) != 0) {
              i._2_1_ = 0;
              pvVar5 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)component.field_2._8_8_,script.field_2._8_8_);
              std::__cxx11::string::string(local_f8,(string *)pvVar5);
              pcVar1 = (this->super_cmCommand).Makefile;
              pcVar8 = (cmInstallScriptGenerator *)operator_new(0xe0);
              pcVar7 = (char *)std::__cxx11::string::c_str();
              pcVar9 = (char *)std::__cxx11::string::c_str();
              cmInstallScriptGenerator::cmInstallScriptGenerator(pcVar8,pcVar7,true,pcVar9);
              cmMakefile::AddInstallGenerator(pcVar1,(cmInstallGenerator *)pcVar8);
              std::__cxx11::string::~string(local_f8);
            }
          }
          else {
            i._3_1_ = 0;
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)component.field_2._8_8_,script.field_2._8_8_);
            std::__cxx11::string::string((string *)local_b0,(string *)pvVar5);
            pcVar7 = (char *)std::__cxx11::string::c_str();
            bVar3 = cmsys::SystemTools::FileIsFullPath(pcVar7);
            if (!bVar3) {
              pcVar7 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
              std::__cxx11::string::operator=((string *)local_b0,pcVar7);
              std::__cxx11::string::operator+=((string *)local_b0,"/");
              pvVar5 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)component.field_2._8_8_,script.field_2._8_8_);
              std::__cxx11::string::operator+=((string *)local_b0,(string *)pvVar5);
            }
            bVar3 = cmsys::SystemTools::FileIsDirectory((string *)local_b0);
            if (bVar3) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_d0,"given a directory as value of SCRIPT argument.",
                         (allocator *)(code.field_2._M_local_buf + 0xf));
              cmCommand::SetError(&this->super_cmCommand,&local_d0);
              std::__cxx11::string::~string((string *)&local_d0);
              std::allocator<char>::~allocator((allocator<char> *)(code.field_2._M_local_buf + 0xf))
              ;
              this_local._7_1_ = 0;
            }
            else {
              pcVar1 = (this->super_cmCommand).Makefile;
              pcVar8 = (cmInstallScriptGenerator *)operator_new(0xe0);
              pcVar7 = (char *)std::__cxx11::string::c_str();
              pcVar9 = (char *)std::__cxx11::string::c_str();
              cmInstallScriptGenerator::cmInstallScriptGenerator(pcVar8,pcVar7,false,pcVar9);
              cmMakefile::AddInstallGenerator(pcVar1,(cmInstallGenerator *)pcVar8);
            }
            i_1._0_4_ = (uint)bVar3;
            std::__cxx11::string::~string((string *)local_b0);
            if ((uint)i_1 != 0) goto LAB_004ca2f7;
          }
        }
      }
    }
    if ((i._3_1_ & 1) == 0) {
      if ((i._2_1_ & 1) == 0) {
        this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmGlobalGenerator::AddInstallComponent(this_00,pcVar7);
        this_local._7_1_ = 1;
        i_1._0_4_ = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_140,"given no value for CODE argument.",&local_141);
        cmCommand::SetError(&this->super_cmCommand,&local_140);
        std::__cxx11::string::~string((string *)&local_140);
        std::allocator<char>::~allocator((allocator<char> *)&local_141);
        this_local._7_1_ = 0;
        i_1._0_4_ = 1;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_118,"given no value for SCRIPT argument.",&local_119);
      cmCommand::SetError(&this->super_cmCommand,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator((allocator<char> *)&local_119);
      this_local._7_1_ = 0;
      i_1._0_4_ = 1;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_80,
               "given more than one COMPONENT for the SCRIPT or CODE signature of the INSTALL command. Use multiple INSTALL commands with one COMPONENT each."
               ,(allocator *)((long)&i_1 + 7));
    cmCommand::SetError(&this->super_cmCommand,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 7));
    this_local._7_1_ = 0;
    i_1._0_4_ = 1;
  }
LAB_004ca2f7:
  std::__cxx11::string::~string(local_40);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmInstallCommand::HandleScriptMode(std::vector<std::string> const& args)
{
  std::string component = this->DefaultComponentName;
  int componentCount = 0;
  bool doing_script = false;
  bool doing_code = false;

  // Scan the args once for COMPONENT. Only allow one.
  //
  for(size_t i=0; i < args.size(); ++i)
    {
    if(args[i] == "COMPONENT" && i+1 < args.size())
        {
        ++componentCount;
        ++i;
        component = args[i];
        }
    }

  if(componentCount>1)
    {
    this->SetError("given more than one COMPONENT for the SCRIPT or CODE "
      "signature of the INSTALL command. "
      "Use multiple INSTALL commands with one COMPONENT each.");
    return false;
    }

  // Scan the args again, this time adding install generators each time we
  // encounter a SCRIPT or CODE arg:
  //
  for(size_t i=0; i < args.size(); ++i)
    {
    if(args[i] == "SCRIPT")
      {
      doing_script = true;
      doing_code = false;
      }
    else if(args[i] == "CODE")
      {
      doing_script = false;
      doing_code = true;
      }
    else if(args[i] == "COMPONENT")
      {
      doing_script = false;
      doing_code = false;
      }
    else if(doing_script)
      {
      doing_script = false;
      std::string script = args[i];
      if(!cmSystemTools::FileIsFullPath(script.c_str()))
        {
        script = this->Makefile->GetCurrentSourceDirectory();
        script += "/";
        script += args[i];
        }
      if(cmSystemTools::FileIsDirectory(script))
        {
        this->SetError("given a directory as value of SCRIPT argument.");
        return false;
        }
      this->Makefile->AddInstallGenerator(
        new cmInstallScriptGenerator(script.c_str(), false,
                                     component.c_str()));
      }
    else if(doing_code)
      {
      doing_code = false;
      std::string code = args[i];
      this->Makefile->AddInstallGenerator(
        new cmInstallScriptGenerator(code.c_str(), true,
                                     component.c_str()));
      }
    }

  if(doing_script)
    {
    this->SetError("given no value for SCRIPT argument.");
    return false;
    }
  if(doing_code)
    {
    this->SetError("given no value for CODE argument.");
    return false;
    }

  //Tell the global generator about any installation component names specified.
  this->Makefile->GetGlobalGenerator()
                             ->AddInstallComponent(component.c_str());

  return true;
}